

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

ptls_t * ptls_client_new(ptls_context_t *ctx)

{
  uint8_t *puVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  int iVar4;
  ptls_t *tls;
  void *get_sni_arg;
  int includes_appdata;
  
  tls = new_instance(ctx,0);
  tls->state = PTLS_STATE_CLIENT_HANDSHAKE_START;
  (*tls->ctx->random_bytes)(tls->client_random,0x20);
  log_client_random(tls);
  if ((tls->field_0x1e8 & 4) != 0) {
    puVar1 = (uint8_t *)((long)&tls->field_19 + 0x10);
    (tls->field_19).client.legacy_session_id.base = puVar1;
    (tls->field_19).client.legacy_session_id.len = 0x20;
    (*tls->ctx->random_bytes)(puVar1,0x20);
  }
  uVar2 = ptls_log_point_maybe_active(&ptls_client_new::logpoint);
  if (uVar2 != 0) {
    uVar3 = ptls_log_conn_maybe_active(&tls->log_state,(_func_char_ptr_void_ptr *)tls,get_sni_arg);
    if ((uVar3 & uVar2) != 0) {
      includes_appdata = 0;
      do {
        ptls_log__do_write_start(&ptls_client_new::logpoint,1);
        ptls_log__do_push_element_unsigned64(",\"tls\":",7,(uint64_t)tls);
        ptls_log__do_push_element_bool(",\"is_server\":",0xd,0);
        iVar4 = ptls_log__do_write_end
                          (&ptls_client_new::logpoint,&tls->log_state,ptls_get_server_name,tls,
                           includes_appdata);
        includes_appdata = 1;
      } while (iVar4 != 0);
    }
  }
  return tls;
}

Assistant:

ptls_t *ptls_client_new(ptls_context_t *ctx)
{
    ptls_t *tls = new_instance(ctx, 0);
    tls->state = PTLS_STATE_CLIENT_HANDSHAKE_START;
    tls->ctx->random_bytes(tls->client_random, sizeof(tls->client_random));
    log_client_random(tls);
    if (tls->send_change_cipher_spec) {
        tls->client.legacy_session_id =
            ptls_iovec_init(tls->client.legacy_session_id_buf, sizeof(tls->client.legacy_session_id_buf));
        tls->ctx->random_bytes(tls->client.legacy_session_id.base, tls->client.legacy_session_id.len);
    }

    PTLS_PROBE(NEW, tls, 0);
    PTLS_LOG_CONN(new, tls, { PTLS_LOG_ELEMENT_BOOL(is_server, 0); });
    return tls;
}